

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_stricmpn(char *s1,char *s2,int n)

{
  int iVar1;
  int iVar2;
  int local_30;
  int d;
  int c2;
  int c1;
  int n_local;
  char *s2_local;
  char *s1_local;
  
  c2 = n;
  _c1 = s2;
  s2_local = s1;
  if (n < 0) {
    __assert_fail("n >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x12df,"int nk_stricmpn(const char *, const char *, int)");
  }
  while( true ) {
    iVar1 = (int)*s2_local;
    iVar2 = (int)*_c1;
    if (c2 == 0) {
      return 0;
    }
    local_30 = iVar1 - iVar2;
    if (((local_30 != 0) &&
        (((0x5a < iVar1 || (iVar1 < 0x41)) || (local_30 = local_30 + 0x20, local_30 != 0)))) &&
       (((0x5a < iVar2 || (iVar2 < 0x41)) || (local_30 = local_30 + -0x20, local_30 != 0)))) break;
    c2 = c2 + -1;
    _c1 = _c1 + 1;
    s2_local = s2_local + 1;
    if (iVar1 == 0) {
      return 0;
    }
  }
  return (uint)(-1 < local_30) * 2 + -1;
}

Assistant:

NK_API int
nk_stricmpn(const char *s1, const char *s2, int n)
{
    int c1,c2,d;
    NK_ASSERT(n >= 0);
    do {
        c1 = *s1++;
        c2 = *s2++;
        if (!n--) return 0;

        d = c1 - c2;
        while (d) {
            if (c1 <= 'Z' && c1 >= 'A') {
                d += ('a' - 'A');
                if (!d) break;
            }
            if (c2 <= 'Z' && c2 >= 'A') {
                d -= ('a' - 'A');
                if (!d) break;
            }
            return ((d >= 0) << 1) - 1;
        }
    } while (c1);
    return 0;
}